

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,EnumReservedRange *proto,EnumDescriptor *parent,
          ReservedRange *result,FlatAllocator *param_4)

{
  int iVar1;
  int iVar2;
  string_view element_name;
  
  iVar1 = (proto->field_0)._impl_.start_;
  result->start = iVar1;
  iVar2 = (proto->field_0)._impl_.end_;
  result->end = iVar2;
  if (iVar2 < iVar1) {
    element_name._M_str = parent->all_names_[1]._M_dataplus._M_p;
    element_name._M_len = parent->all_names_[1]._M_string_length;
    AddError(this,element_name,&proto->super_Message,NUMBER,
             "Reserved range end number must be greater than start number.");
    return;
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const EnumDescriptorProto::EnumReservedRange& proto,
    const EnumDescriptor* parent, EnumDescriptor::ReservedRange* result,
    internal::FlatAllocator&) {
  result->start = proto.start();
  result->end = proto.end();

  if (result->start > result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}